

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNStat.cpp
# Opt level: O0

void __thiscall
NaPNStatistics::halt_condition(NaPNStatistics *this,int stat_id,int sign,NaReal value)

{
  int in_EDX;
  uint in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  
  if (((int)in_ESI < 0) || (6 < (int)in_ESI)) {
    NaPrintLog("NaPNStatistics::halt_condition(): unknown id=%d\n",(ulong)in_ESI);
  }
  *(uint *)(in_RDI + 0x1c8) = 1 << ((byte)in_ESI & 0x1f) | *(uint *)(in_RDI + 0x1c8);
  *(undefined8 *)(in_RDI + (long)(int)in_ESI * 0x10 + 0x1d8) = in_XMM0_Qa;
  if (in_EDX < 0) {
    *(undefined4 *)(in_RDI + 0x1d0 + (long)(int)in_ESI * 0x10) = 0xffffffff;
  }
  else if (in_EDX < 1) {
    *(undefined4 *)(in_RDI + 0x1d0 + (long)(int)in_ESI * 0x10) = 0;
  }
  else {
    *(undefined4 *)(in_RDI + 0x1d0 + (long)(int)in_ESI * 0x10) = 1;
  }
  return;
}

Assistant:

void
NaPNStatistics::halt_condition (int stat_id, int sign, NaReal value)
{
  if(stat_id < NaSI_ABSMEAN || stat_id > NaSI_ABSMAX){
    NaPrintLog("NaPNStatistics::halt_condition(): unknown id=%d\n", stat_id);
  }

  mHalt |= NaSIdToMask(stat_id);
  HaltCond[stat_id].value = value;

  if(sign < 0)
    HaltCond[stat_id].sign = LESS_THAN;
  else if(sign > 0)
    HaltCond[stat_id].sign = GREATER_THAN;
  else
    HaltCond[stat_id].sign = EQUAL_TO;
}